

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkColumnOverlap(IdList *pIdList,ExprList *pEList)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (pEList != (ExprList *)0x0 && pIdList != (IdList *)0x0) {
    uVar2 = (ulong)(uint)pEList->nExpr;
    if (pEList->nExpr < 1) {
      uVar2 = 0;
    }
    uVar3 = 0;
    do {
      if (uVar2 * 0x18 + 0x18 == uVar3 + 0x18) {
        return 0;
      }
      iVar1 = sqlite3IdListIndex(pIdList,*(char **)((long)&pEList->a[0].zEName + uVar3));
      uVar3 = uVar3 + 0x18;
    } while (iVar1 < 0);
  }
  return 1;
}

Assistant:

static int checkColumnOverlap(IdList *pIdList, ExprList *pEList){
  int e;
  if( pIdList==0 || NEVER(pEList==0) ) return 1;
  for(e=0; e<pEList->nExpr; e++){
    if( sqlite3IdListIndex(pIdList, pEList->a[e].zEName)>=0 ) return 1;
  }
  return 0;
}